

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chain_matrix.h
# Opt level: O3

void __thiscall
Gudhi::persistence_matrix::
Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_false>_>_>
::_reduce_by_G(Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_false>_>_>
               *this,Tmp_column *column,
              vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
              *chainsInH,Index currentIndex)

{
  pointer pIVar1;
  ID_index IVar2;
  uint uVar3;
  pointer pIVar4;
  Column_settings *pCVar5;
  uint uVar6;
  long lVar7;
  iterator __position;
  uint uVar8;
  Column_support *pCVar9;
  long *plVar10;
  pair<std::_Rb_tree_iterator<std::pair<const_unsigned_int,_unsigned_int>_>,_bool> pVar11;
  uint local_50;
  uint local_4c;
  pointer local_48;
  vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
  *local_40;
  Index local_34;
  
  pIVar4 = (this->matrix_).
           super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_false>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pIVar1 = pIVar4 + currentIndex;
  IVar2 = pIVar4[currentIndex].super_Chain_column_option.pivot_;
  uVar8 = 0;
  if (IVar2 != 0xffffffff) {
    pCVar9 = &pIVar1->column_;
    do {
      pCVar9 = *(Column_support **)&(pCVar9->super_type).data_.root_plus_size_;
      uVar8 = 0;
      if (pCVar9 == &pIVar1->column_) goto LAB_0011c072;
    } while (*(ID_index *)(pCVar9 + 1) != IVar2);
    uVar8 = *(uint *)((long)(pCVar9 + -1) + 8);
  }
LAB_0011c072:
  pCVar5 = this->colSettings_;
  uVar3 = (pCVar5->operators).characteristic_;
  if (uVar3 <= uVar8) {
    uVar8 = uVar8 % uVar3;
  }
  local_50 = (pCVar5->operators).inverse_.
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start[uVar8];
  local_40 = (vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
              *)chainsInH;
  lVar7 = std::_Rb_tree_decrement(&(column->_M_t)._M_impl.super__Rb_tree_header._M_header);
  persistence_fields::Zp_field_operators<unsigned_int,_void>::multiply_inplace
            (&pCVar5->operators,&local_50,uVar3 - *(int *)(lVar7 + 0x24));
  uVar8 = local_50;
  plVar10 = *(long **)&(pIVar1->column_).super_type.data_.root_plus_size_;
  local_48 = pIVar1;
  if ((Column_support *)plVar10 != &pIVar1->column_) {
    pCVar5 = this->colSettings_;
    do {
      local_4c = *(uint *)(plVar10 + 2);
      pVar11 = std::
               _Rb_tree<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::_Select1st<std::pair<unsigned_int_const,unsigned_int>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>
               ::_M_emplace_unique<unsigned_int,unsigned_int_const&>
                         ((_Rb_tree<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::_Select1st<std::pair<unsigned_int_const,unsigned_int>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>
                           *)column,&local_4c,(uint *)(plVar10 + -1));
      __position._M_node = (_Base_ptr)pVar11.first._M_node;
      if (((undefined1  [16])pVar11 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        uVar6 = *(uint *)(plVar10 + -1) * uVar8 + *(int *)&__position._M_node[1].field_0x4;
        uVar3 = (pCVar5->operators).characteristic_;
        if (uVar3 <= uVar6) {
          uVar6 = uVar6 % uVar3;
        }
        *(uint *)&__position._M_node[1].field_0x4 = uVar6;
        if (uVar6 == 0) {
          std::
          _Rb_tree<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::_Select1st<std::pair<unsigned_int_const,unsigned_int>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>
          ::erase_abi_cxx11_((_Rb_tree<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::_Select1st<std::pair<unsigned_int_const,unsigned_int>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>
                              *)column,__position);
        }
      }
      else {
        persistence_fields::Zp_field_operators<unsigned_int,_void>::multiply_inplace
                  (&pCVar5->operators,(Element *)&__position._M_node[1].field_0x4,uVar8);
      }
      plVar10 = (long *)*plVar10;
    } while ((Column_support *)plVar10 != &pIVar1->column_);
  }
  local_34 = (local_48->super_Chain_column_option).pairedColumn_;
  std::
  vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
  ::emplace_back<unsigned_int,unsigned_int&>(local_40,&local_34,&local_50);
  return;
}

Assistant:

inline void Chain_matrix<Master_matrix>::_reduce_by_G(Tmp_column& column,
                                                      std::vector<Entry_representative>& chainsInH,
                                                      Index currentIndex)
{
  Column& col = get_column(currentIndex);
  if constexpr (Master_matrix::Option_list::is_z2) {
    _add_to(col, column, 1u);                           // Reduce with the column col_g
    chainsInH.push_back(col.get_paired_chain_index());  // keep the col_h with which col_g is paired
  } else {
    Field_element coef = col.get_pivot_value();
    auto& operators = colSettings_->operators;
    coef = operators.get_inverse(coef);
    operators.multiply_inplace(coef, operators.get_characteristic() - column.rbegin()->second);

    _add_to(col, column, coef);                                       // Reduce with the column col_g
    chainsInH.emplace_back(col.get_paired_chain_index(), coef); // keep the col_h with which col_g is paired
  }
}